

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O0

void __thiscall
fmt::v10::formatter<ktx::SelectorRange,_char,_void>::formatter
          (formatter<ktx::SelectorRange,_char,_void> *this)

{
  formatter<unsigned_int,_char,_void>::formatter((formatter<unsigned_int,_char,_void> *)0x282bde);
  return;
}

Assistant:

auto format(const ktx::SelectorRange& var, FormatContext& ctx) const -> decltype(ctx.out()) {
        if (var == ktx::all)
            return formatter<std::string_view>{}.format("all", ctx);
        else if (var.is_empty())
            return formatter<std::string_view>{}.format("none", ctx);
        else {
            bool first = true;
            auto out = ctx.out();
            for (const auto& range : var._ranges()) {
                if (!first) {
                    out = fmt::format_to(out, ",");
                    ctx.advance_to(out);
                }
                first = false;

                if (range.begin + 1 == range.end) {
                    out = fmt::format_to(out, "{}", range.begin);
                    ctx.advance_to(out);
                } else if (range.end == ktx::RangeEnd) {
                    out = fmt::format_to(out, "{}..last", range.begin);
                    ctx.advance_to(out);
                } else {
                    out = fmt::format_to(out, "{}..{}", range.begin, range.end - 1);
                    ctx.advance_to(out);
                }
            }

            return out;
        }
    }